

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_tests.cc
# Opt level: O0

void __thiscall
lf::assemble::test::BoundaryAssembler::BoundaryAssembler
          (BoundaryAssembler *this,shared_ptr<lf::mesh::Mesh> *mesh_p)

{
  shared_ptr<const_lf::mesh::Mesh> local_28;
  shared_ptr<lf::mesh::Mesh> *local_18;
  shared_ptr<lf::mesh::Mesh> *mesh_p_local;
  BoundaryAssembler *this_local;
  
  local_18 = mesh_p;
  mesh_p_local = (shared_ptr<lf::mesh::Mesh> *)this;
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::Matrix(&this->mat_);
  std::shared_ptr<lf::mesh::Mesh>::shared_ptr(&this->mesh_p_,mesh_p);
  std::shared_ptr<lf::mesh::Mesh_const>::shared_ptr<lf::mesh::Mesh,void>
            ((shared_ptr<lf::mesh::Mesh_const> *)&local_28,&this->mesh_p_);
  lf::mesh::utils::CountNumSuperEntities(&this->cells_at_edges_,&local_28,1,1);
  std::shared_ptr<const_lf::mesh::Mesh>::~shared_ptr(&local_28);
  return;
}

Assistant:

BoundaryAssembler::BoundaryAssembler(std::shared_ptr<lf::mesh::Mesh> mesh_p)
    : mesh_p_(std::move(mesh_p)),
      cells_at_edges_(lf::mesh::utils::CountNumSuperEntities(mesh_p_, 1, 1)) {}